

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::java::anon_unknown_0::FieldDescriptorCompare::operator()
          (FieldDescriptorCompare *this,FieldDescriptor *f1,FieldDescriptor *f2)

{
  ushort uVar1;
  ushort uVar2;
  char *pcVar3;
  int iVar4;
  ulong __n;
  ulong uVar5;
  ulong uVar6;
  
  if (this == (FieldDescriptorCompare *)0x0) {
    return false;
  }
  if (f1 == (FieldDescriptor *)0x0) {
    return true;
  }
  uVar1 = *(ushort *)(*(long *)(this + 8) + 2);
  uVar5 = (ulong)uVar1;
  pcVar3 = (f1->all_names_).payload_;
  uVar2 = *(ushort *)(pcVar3 + 2);
  uVar6 = (ulong)uVar2;
  __n = uVar6;
  if (uVar5 < uVar6) {
    __n = uVar5;
  }
  if (__n != 0) {
    iVar4 = memcmp((void *)(*(long *)(this + 8) + ~uVar5),pcVar3 + ~uVar6,__n);
    if (iVar4 != 0) goto LAB_00e609a2;
  }
  iVar4 = (uint)uVar1 - (uint)uVar2;
LAB_00e609a2:
  return SUB41((uint)iVar4 >> 0x1f,0);
}

Assistant:

bool operator()(const FieldDescriptor* f1, const FieldDescriptor* f2) const {
    if (f1 == nullptr) {
      return false;
    }
    if (f2 == nullptr) {
      return true;
    }
    return f1->full_name() < f2->full_name();
  }